

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalWatcomWMakeGenerator::EnableLanguage
          (cmGlobalWatcomWMakeGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *l,cmMakefile *mf,bool optional)

{
  cmMakefile *pcVar1;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  byte local_21;
  cmMakefile *pcStack_20;
  bool optional_local;
  cmMakefile *mf_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *l_local;
  cmGlobalWatcomWMakeGenerator *this_local;
  
  local_21 = optional;
  pcStack_20 = mf;
  mf_local = (cmMakefile *)l;
  l_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"WATCOM",&local_49);
  cmMakefile::AddDefinition(mf,&local_48,"1");
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"CMAKE_QUOTE_INCLUDE_PATHS",&local_81);
  cmMakefile::AddDefinition(pcVar1,&local_80,"1");
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"CMAKE_MANGLE_OBJECT_FILE_NAMES",&local_a9);
  cmMakefile::AddDefinition(pcVar1,&local_a8,"1");
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"CMAKE_MAKE_LINE_CONTINUE",&local_d1);
  cmMakefile::AddDefinition(pcVar1,&local_d0,"&");
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"CMAKE_MAKE_SYMBOLIC_RULE",&local_f9);
  cmMakefile::AddDefinition(pcVar1,&local_f8,".SYMBOLIC");
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"CMAKE_GENERATOR_CC",&local_121);
  cmMakefile::AddDefinition(pcVar1,&local_120,"wcl386");
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"CMAKE_GENERATOR_CXX",&local_149);
  cmMakefile::AddDefinition(pcVar1,&local_148,"wcl386");
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  cmGlobalUnixMakefileGenerator3::EnableLanguage
            (&this->super_cmGlobalUnixMakefileGenerator3,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)mf_local,pcStack_20,(bool)(local_21 & 1));
  return;
}

Assistant:

void cmGlobalWatcomWMakeGenerator::EnableLanguage(
  std::vector<std::string> const& l, cmMakefile* mf, bool optional)
{
  // pick a default
  mf->AddDefinition("WATCOM", "1");
  mf->AddDefinition("CMAKE_QUOTE_INCLUDE_PATHS", "1");
  mf->AddDefinition("CMAKE_MANGLE_OBJECT_FILE_NAMES", "1");
  mf->AddDefinition("CMAKE_MAKE_LINE_CONTINUE", "&");
  mf->AddDefinition("CMAKE_MAKE_SYMBOLIC_RULE", ".SYMBOLIC");
  mf->AddDefinition("CMAKE_GENERATOR_CC", "wcl386");
  mf->AddDefinition("CMAKE_GENERATOR_CXX", "wcl386");
  this->cmGlobalUnixMakefileGenerator3::EnableLanguage(l, mf, optional);
}